

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O0

int fftkyn(fitsfile *fptr,int numkey,char *name,char *value,int *status)

{
  int iVar1;
  char *in_RCX;
  char *in_RDX;
  uint in_ESI;
  int *in_R8;
  char message [81];
  char comm [73];
  char valuestring [71];
  char keyname [75];
  char acStack_188 [176];
  char local_d8 [24];
  int *in_stack_ffffffffffffff40;
  char *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff64;
  fitsfile *in_stack_ffffffffffffff68;
  char local_88 [88];
  int *local_30;
  char *local_28;
  char *local_20;
  uint local_14;
  int local_4;
  
  if (*in_R8 < 1) {
    local_88[0] = '\0';
    local_d8[0] = '\0';
    local_30 = in_R8;
    local_28 = in_RCX;
    local_20 = in_RDX;
    local_14 = in_ESI;
    iVar1 = ffgkyn(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,in_stack_ffffffffffffff58,
                   in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    if (iVar1 < 1) {
      iVar1 = strcmp(local_88,local_20);
      if (iVar1 != 0) {
        *local_30 = 0xd0;
      }
      iVar1 = strcmp(local_28,local_d8);
      if (iVar1 != 0) {
        *local_30 = 0xd1;
      }
    }
    if (0 < *local_30) {
      snprintf(acStack_188,0x51,"fftkyn found unexpected keyword or value for keyword no. %d.",
               (ulong)local_14);
      ffpmsg((char *)0x1c3ddf);
      snprintf(acStack_188,0x51," Expected keyword %s with value %s, but",local_20,local_28);
      ffpmsg((char *)0x1c3e0d);
      snprintf(acStack_188,0x51," found keyword %s with value %s",local_88,local_d8);
      ffpmsg((char *)0x1c3e3b);
    }
    local_4 = *local_30;
  }
  else {
    local_4 = *in_R8;
  }
  return local_4;
}

Assistant:

int fftkyn(fitsfile *fptr,  /* I - FITS file pointer              */
           int numkey,      /* I - number of the keyword to read  */
           char *name,      /* I - expected name of the keyword   */
           char *value,     /* I - expected value of the keyword  */
           int *status)     /* IO - error status                  */
{
/*
  test that keyword number NUMKEY has the expected name and the
  expected value string.
*/
    char keyname[FLEN_KEYWORD], valuestring[FLEN_VALUE];
    char comm[FLEN_COMMENT], message[FLEN_ERRMSG];
   
    if (*status > 0)
        return(*status);
    
    keyname[0] = '\0';
    valuestring[0] = '\0';

    if (ffgkyn(fptr, numkey, keyname, valuestring, comm, status) <= 0)
    {
        if (strcmp(keyname, name) )
            *status = BAD_ORDER;  /* incorrect keyword name */

        if (strcmp(value, valuestring) )
            *status = NOT_POS_INT;  /* incorrect keyword value */
    }

    if (*status > 0)
    {
        snprintf(message, FLEN_ERRMSG,
          "fftkyn found unexpected keyword or value for keyword no. %d.",
          numkey);
        ffpmsg(message);

        snprintf(message, FLEN_ERRMSG,
          " Expected keyword %s with value %s, but", name, value);
        ffpmsg(message);

        snprintf(message, FLEN_ERRMSG,
          " found keyword %s with value %s", keyname, valuestring);
        ffpmsg(message);
    }

    return(*status);
}